

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

string * __thiscall
FastPForLib::CompositeCodec<FastPForLib::SIMDFastPFor<4u>,FastPForLib::VariableByte>::
name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  SIMDFastPFor<4u>::name_abi_cxx11_(&local_38,(void *)((long)this + 8));
  std::operator+(&local_58,&local_38,"+");
  VariableByte::name_abi_cxx11_(&sStack_78,(VariableByte *)((long)this + 0x48));
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    return codec1.name() + "+" + codec2.name();
  }